

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zCrcOpt.c
# Opt level: O2

UInt32 CrcUpdateT4(UInt32 v,void *data,size_t size,UInt32 *table)

{
  uint uVar1;
  ulong uVar2;
  Byte *p;
  ulong uVar3;
  uint *puVar4;
  
  uVar2 = (ulong)v;
  puVar4 = (uint *)data;
  for (; (size != 0 && (((ulong)data & 3) != 0)); data = (void *)((long)data + 1)) {
    uVar2 = (ulong)((uint)(uVar2 >> 8) ^ table[(byte)((byte)*puVar4 ^ (byte)uVar2)]);
    puVar4 = (uint *)((long)puVar4 + 1);
    size = size - 1;
  }
  for (; 3 < size; size = size - 4) {
    uVar1 = (uint)uVar2 ^ *puVar4;
    puVar4 = puVar4 + 1;
    uVar2 = (ulong)(*(uint *)((long)table + (ulong)(uVar1 >> 6 & 0x3fc) + 0x800) ^
                    table[(ulong)(uVar1 & 0xff) + 0x300] ^
                    *(uint *)((long)table + (ulong)(uVar1 >> 0xe & 0x3fc) + 0x400) ^
                   table[uVar1 >> 0x18]);
  }
  for (uVar3 = 0; size != uVar3; uVar3 = uVar3 + 1) {
    uVar2 = (ulong)((UInt32)uVar2 >> 8 ^
                   table[(byte)(*(byte *)((long)puVar4 + uVar3) ^ (byte)uVar2)]);
  }
  return (UInt32)uVar2;
}

Assistant:

UInt32 MY_FAST_CALL CrcUpdateT4(UInt32 v, const void *data, size_t size, const UInt32 *table)
{
  const Byte *p = (const Byte *)data;
  for (; size > 0 && ((unsigned)(ptrdiff_t)p & 3) != 0; size--, p++)
    v = CRC_UPDATE_BYTE_2(v, *p);
  for (; size >= 4; size -= 4, p += 4)
  {
    v ^= *(const UInt32 *)p;
    v =
          table[0x300 + ((v      ) & 0xFF)]
        ^ table[0x200 + ((v >>  8) & 0xFF)]
        ^ table[0x100 + ((v >> 16) & 0xFF)]
        ^ table[0x000 + ((v >> 24))];
  }
  for (; size > 0; size--, p++)
    v = CRC_UPDATE_BYTE_2(v, *p);
  return v;
}